

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_data.cpp
# Opt level: O0

void __thiscall ximu::DateTimeData::DateTimeData(DateTimeData *this,tm *t)

{
  tm *t_local;
  DateTimeData *this_local;
  
  DateTimeData(this,(long)t->tm_year,(long)t->tm_mon,(long)t->tm_mday,(long)t->tm_hour,
               (long)t->tm_min,(long)t->tm_sec);
  return;
}

Assistant:

DateTimeData::DateTimeData(const std::tm& t)
    :
    DateTimeData(t.tm_year, t.tm_mon, t.tm_mday,
                 t.tm_hour, t.tm_min, t.tm_sec) {
}